

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_draw.c
# Opt level: O0

int main(int argc,char **argv)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  undefined8 uVar4;
  ALLEGRO_EVENT_QUEUE *pAVar5;
  undefined8 uVar6;
  char str [256];
  char *value;
  ALLEGRO_CONFIG *config;
  ALLEGRO_TIMER *timer;
  ALLEGRO_DISPLAY *display;
  char local_138 [168];
  long local_28;
  
  uVar1 = al_install_system(0x5020700,atexit);
  if ((uVar1 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_init_primitives_addon();
  al_install_keyboard();
  al_install_mouse();
  al_init_image_addon();
  al_init_font_addon();
  init_platform_specific();
  ex.samples = 0;
  local_28 = al_load_config_file("ex_draw.ini");
  if (local_28 == 0) {
    local_28 = al_create_config();
  }
  pcVar2 = (char *)al_get_config_value(local_28,"settings","samples");
  if (pcVar2 != (char *)0x0) {
    lVar3 = strtol(pcVar2,(char **)0x0,0);
    ex.samples = (int)lVar3;
  }
  sprintf(local_138,"%d",(ulong)(uint)ex.samples);
  al_set_config_value(local_28,"settings","samples",local_138);
  al_save_config_file("ex_draw.ini",local_28);
  al_destroy_config(local_28);
  if (ex.samples != 0) {
    al_set_new_display_option(0x11,1);
    al_set_new_display_option(0x12,ex.samples,2);
  }
  pcVar2 = (char *)0x280;
  lVar3 = al_create_display();
  if (lVar3 == 0) {
    pcVar2 = "Unable to create display.\n";
    abort_example();
  }
  init((EVP_PKEY_CTX *)pcVar2);
  uVar4 = al_create_timer(1.0 / (double)ex.FPS);
  pAVar5 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
  ex.queue = pAVar5;
  uVar6 = al_get_keyboard_event_source();
  al_register_event_source(pAVar5,uVar6);
  pAVar5 = ex.queue;
  uVar6 = al_get_mouse_event_source();
  al_register_event_source(pAVar5,uVar6);
  pAVar5 = ex.queue;
  uVar6 = al_get_display_event_source(lVar3);
  al_register_event_source(pAVar5,uVar6);
  pAVar5 = ex.queue;
  uVar6 = al_get_timer_event_source(uVar4);
  al_register_event_source(pAVar5,uVar6);
  al_start_timer(uVar4);
  run();
  al_destroy_event_queue(ex.queue);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_TIMER *timer;
   ALLEGRO_CONFIG *config;
   char const *value;
   char str[256];

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   
   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();
   al_init_image_addon();
   al_init_font_addon();
   init_platform_specific();

   /* Read supersampling info from ex_draw.ini. */
   ex.samples = 0;
   config = al_load_config_file("ex_draw.ini");
   if (!config)
      config = al_create_config();
   value = al_get_config_value(config, "settings", "samples");
   if (value)
      ex.samples = strtol(value, NULL, 0);
   sprintf(str, "%d", ex.samples);
   al_set_config_value(config, "settings", "samples", str);
   al_save_config_file("ex_draw.ini", config);
   al_destroy_config(config);

   if (ex.samples) {
      al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_REQUIRE);
      al_set_new_display_option(ALLEGRO_SAMPLES, ex.samples, ALLEGRO_SUGGEST);
   }
   display = al_create_display(640, 640);
   if (!display) {
      abort_example("Unable to create display.\n");
   }

   init();

   timer = al_create_timer(1.0 / ex.FPS);

   ex.queue = al_create_event_queue();
   al_register_event_source(ex.queue, al_get_keyboard_event_source());
   al_register_event_source(ex.queue, al_get_mouse_event_source());
   al_register_event_source(ex.queue, al_get_display_event_source(display));
   al_register_event_source(ex.queue, al_get_timer_event_source(timer));

   al_start_timer(timer);
   run();

   al_destroy_event_queue(ex.queue);  

   return 0;
}